

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall crnlib::mipmapped_texture::vertical_cross_to_cubemap(mipmapped_texture *this)

{
  int iVar1;
  image_u8 *piVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  bool bVar5;
  image_u8 *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint x;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  image_u8 tmp_img;
  mipmapped_texture cubemap;
  
  bVar5 = is_vertical_cross(this);
  if (bVar5) {
    uVar16 = this->m_height >> 2;
    has_alpha(this);
    cubemap.m_name.m_buf_size = 0;
    cubemap.m_name.m_len = 0;
    cubemap.m_name.m_pStr = (char *)0x0;
    cubemap.m_width = 0;
    cubemap.m_height = 0;
    cubemap.m_comp_flags = cDefaultCompFlags;
    cubemap._28_8_ = 0;
    cubemap.m_faces._4_8_ = 0;
    cubemap.m_faces.m_capacity = 0;
    cubemap.m_source_file_type = cFormatInvalid;
    cubemap.m_last_error.m_buf_size = 0;
    cubemap.m_last_error.m_len = 0;
    cubemap.m_last_error.m_pStr = (char *)0x0;
    init(&cubemap,(EVP_PKEY_CTX *)(ulong)uVar16);
    for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
      tmp_img.m_width = 0;
      tmp_img.m_height = 0;
      tmp_img.m_pitch = 0;
      tmp_img.m_total = 0;
      tmp_img.m_comp_flags = 0xf;
      tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_size = 0;
      tmp_img.m_pixel_buf.m_capacity = 0;
      piVar6 = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&tmp_img,3);
      piVar2 = (*(this->m_faces).m_p[lVar15].m_p)->m_pImage;
      iVar1 = (&g_vertical_cross_image_offsets)[lVar15 * 2];
      iVar9 = (&DAT_00186914)[lVar15 * 2] * uVar16;
      iVar11 = uVar16 - 1;
      for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
        iVar12 = 0;
        iVar13 = iVar1 * uVar16;
        for (iVar14 = uVar16 - 1; iVar14 != -1; iVar14 = iVar14 + -1) {
          if (lVar15 == 5) {
            uVar7 = piVar2->m_pitch * iVar11 + iVar14;
          }
          else {
            uVar7 = piVar2->m_pitch * uVar10 + iVar12;
          }
          uVar8 = piVar6->m_pitch * iVar9 + iVar13;
          pcVar3 = piVar6->m_pPixels;
          pcVar4 = piVar2->m_pPixels;
          pcVar4[uVar7].field_0.field_0.r = pcVar3[uVar8].field_0.field_0.r;
          pcVar4[uVar7].field_0.field_0.g = pcVar3[uVar8].field_0.field_0.g;
          pcVar4[uVar7].field_0.field_0.b = pcVar3[uVar8].field_0.field_0.b;
          pcVar4[uVar7].field_0.field_0.a = pcVar3[uVar8].field_0.field_0.a;
          iVar12 = iVar12 + 1;
          iVar13 = iVar13 + 1;
        }
        iVar11 = iVar11 + -1;
        iVar9 = iVar9 + 1;
      }
      vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp_img.m_pixel_buf);
    }
    swap(this,&cubemap);
    ~mipmapped_texture(&cubemap);
  }
  return bVar5;
}

Assistant:

bool mipmapped_texture::vertical_cross_to_cubemap() {
  if (!is_vertical_cross())
    return false;

  const uint face_width = get_height() / 4;

  bool alpha_is_valid = has_alpha();

  mipmapped_texture cubemap;

  pixel_format fmt = alpha_is_valid ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;

  cubemap.init(face_width, face_width, 1, 6, fmt, m_name.get_ptr(), cDefaultOrientationFlags);

  // +x -x +y -y +z -z
  //     0  1  2
  // 0     +y
  // 1  -x +z +x
  // 2     -y
  // 3     -z

  for (uint face_index = 0; face_index < 6; face_index++) {
    const mip_level* pSrc = get_level(0, 0);

    image_u8 tmp_img;
    image_u8* pSrc_image = pSrc->get_unpacked_image(tmp_img, cUnpackFlagUncook | cUnpackFlagUnflip);

    const mip_level* pDst = get_level(face_index, 0);
    image_u8* pDst_image = pDst->get_image();
    CRNLIB_ASSERT(pDst_image);

    const bool flipped = (face_index == 5);
    const uint x_ofs = g_vertical_cross_image_offsets[face_index][0] * face_width;
    const uint y_ofs = g_vertical_cross_image_offsets[face_index][1] * face_width;

    for (uint y = 0; y < face_width; y++) {
      for (uint x = 0; x < face_width; x++) {
        const color_quad_u8& c = (*pSrc_image)(x_ofs + x, y_ofs + y);

        if (!flipped)
          (*pDst_image)(x, y) = c;
        else
          (*pDst_image)(face_width - 1 - x, face_width - 1 - y) = c;
      }
    }
  }

  swap(cubemap);

  CRNLIB_ASSERT(check());

  return true;
}